

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O1

void __thiscall
duckdb::AsOfLocalSourceState::AsOfLocalSourceState
          (AsOfLocalSourceState *this,AsOfGlobalSourceState *gsource,PhysicalAsOfJoin *op,
          ClientContext *client_p)

{
  pointer pPVar1;
  
  (this->super_LocalSourceState)._vptr_LocalSourceState =
       (_func_int **)&PTR__AsOfLocalSourceState_0249e248;
  this->gsource = gsource;
  this->client = client_p;
  pPVar1 = unique_ptr<duckdb::PartitionGlobalSinkState,_std::default_delete<duckdb::PartitionGlobalSinkState>,_true>
           ::operator->(&gsource->gsink->lhs_sink);
  AsOfProbeBuffer::AsOfProbeBuffer(&this->probe_buffer,pPVar1->context,op);
  (this->hash_group).
  super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl =
       (PartitionGlobalHashGroup *)0x0;
  (this->scanner).
  super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t.
  super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>.
  super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl = (PayloadScanner *)0x0;
  this->found_match = (bool *)0x0;
  LOCK();
  (gsource->mergers).super___atomic_base<unsigned_long>._M_i =
       (gsource->mergers).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

AsOfLocalSourceState::AsOfLocalSourceState(AsOfGlobalSourceState &gsource, const PhysicalAsOfJoin &op,
                                           ClientContext &client_p)
    : gsource(gsource), client(client_p), probe_buffer(gsource.gsink.lhs_sink->context, op) {
	gsource.mergers++;
}